

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
               (void)

{
  allocator<std::pair<unsigned_int,_unsigned_int>_> *this;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_05;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_06;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_07;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_08;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_09;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_10;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_11;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_12;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_13;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_14;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_15;
  undefined8 uVar1;
  bool bVar2;
  pointer __args;
  pointer pPVar3;
  pointer pPVar4;
  reference pPVar5;
  int *__args_00;
  uint *__args_1;
  uint *__args_2;
  type_conflict1 *__args_1_00;
  type_conflict1 *__args_2_00;
  type_conflict *__args_01;
  lazy_ostream *plVar6;
  reference ptVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar11;
  basic_cstring<const_char> local_1780;
  basic_cstring<const_char> local_1770;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1760;
  assertion_result local_1740;
  basic_cstring<const_char> local_1728;
  basic_cstring<const_char> local_1718;
  basic_cstring<const_char> local_1708;
  basic_cstring<const_char> local_16f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_16e8;
  assertion_result local_16c8;
  basic_cstring<const_char> local_16b0;
  basic_cstring<const_char> local_16a0;
  basic_cstring<const_char> local_1690;
  basic_cstring<const_char> local_1680;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1670;
  _Self local_1650;
  assertion_result local_1648;
  basic_cstring<const_char> local_1630;
  basic_cstring<const_char> local_1620;
  undefined4 local_160c;
  basic_cstring<const_char> local_1608;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_15f8;
  basic_cstring<const_char> local_15d0;
  basic_cstring<const_char> local_15c0;
  undefined4 local_15ac;
  basic_cstring<const_char> local_15a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1598;
  basic_cstring<const_char> local_1570;
  basic_cstring<const_char> local_1560;
  undefined4 local_154c;
  basic_cstring<const_char> local_1548;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1538;
  basic_cstring<const_char> local_1510;
  basic_cstring<const_char> local_1500;
  undefined4 local_14ec;
  basic_cstring<const_char> local_14e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_14d8;
  basic_cstring<const_char> local_14b0;
  basic_cstring<const_char> local_14a0;
  undefined4 local_148c;
  basic_cstring<const_char> local_1488;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1478;
  basic_cstring<const_char> local_1450;
  basic_cstring<const_char> local_1440;
  undefined4 local_142c;
  basic_cstring<const_char> local_1428;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1418;
  basic_cstring<const_char> local_13f0;
  basic_cstring<const_char> local_13e0;
  undefined4 local_13cc;
  basic_cstring<const_char> local_13c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_13b8;
  basic_cstring<const_char> local_1390;
  basic_cstring<const_char> local_1380;
  undefined4 local_136c;
  basic_cstring<const_char> local_1368;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1358;
  basic_cstring<const_char> local_1330;
  basic_cstring<const_char> local_1320;
  undefined4 local_130c;
  basic_cstring<const_char> local_1308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_12f8;
  basic_cstring<const_char> local_12d0;
  basic_cstring<const_char> local_12c0;
  undefined4 local_12ac;
  basic_cstring<const_char> local_12a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1298;
  basic_cstring<const_char> local_1270;
  basic_cstring<const_char> local_1260;
  undefined4 local_124c;
  basic_cstring<const_char> local_1248;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1238;
  basic_cstring<const_char> local_1210;
  basic_cstring<const_char> local_1200;
  undefined4 local_11ec;
  basic_cstring<const_char> local_11e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_11d8;
  basic_cstring<const_char> local_11b0;
  basic_cstring<const_char> local_11a0;
  undefined4 local_118c;
  basic_cstring<const_char> local_1188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1178;
  basic_cstring<const_char> local_1150;
  basic_cstring<const_char> local_1140;
  undefined4 local_112c;
  basic_cstring<const_char> local_1128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1118;
  basic_cstring<const_char> local_10f0;
  basic_cstring<const_char> local_10e0;
  undefined4 local_10cc;
  basic_cstring<const_char> local_10c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_10b8;
  basic_cstring<const_char> local_1090;
  basic_cstring<const_char> local_1080;
  undefined4 local_106c;
  basic_cstring<const_char> local_1068;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1058;
  basic_cstring<const_char> local_1030;
  basic_cstring<const_char> local_1020;
  undefined4 local_100c;
  basic_cstring<const_char> local_1008;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ff8;
  basic_cstring<const_char> local_fd0;
  basic_cstring<const_char> local_fc0;
  undefined4 local_fac;
  basic_cstring<const_char> local_fa8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f98;
  basic_cstring<const_char> local_f70;
  basic_cstring<const_char> local_f60;
  undefined4 local_f4c;
  basic_cstring<const_char> local_f48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f38;
  basic_cstring<const_char> local_f10;
  basic_cstring<const_char> local_f00;
  undefined4 local_eec;
  basic_cstring<const_char> local_ee8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ed8;
  basic_cstring<const_char> local_eb0;
  basic_cstring<const_char> local_ea0;
  undefined4 local_e8c;
  basic_cstring<const_char> local_e88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e78;
  basic_cstring<const_char> local_e50;
  basic_cstring<const_char> local_e40;
  undefined4 local_e2c;
  basic_cstring<const_char> local_e28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e18;
  basic_cstring<const_char> local_df0;
  basic_cstring<const_char> local_de0;
  undefined4 local_dcc;
  basic_cstring<const_char> local_dc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_db8;
  basic_cstring<const_char> local_d90;
  basic_cstring<const_char> local_d80;
  undefined4 local_d6c;
  basic_cstring<const_char> local_d68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d58;
  basic_cstring<const_char> local_d30;
  basic_cstring<const_char> local_d20;
  undefined4 local_d0c;
  basic_cstring<const_char> local_d08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_cf8;
  basic_cstring<const_char> local_cd0;
  basic_cstring<const_char> local_cc0;
  undefined4 local_cac;
  basic_cstring<const_char> local_ca8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c98;
  basic_cstring<const_char> local_c70;
  basic_cstring<const_char> local_c60;
  undefined4 local_c4c;
  basic_cstring<const_char> local_c48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c38;
  basic_cstring<const_char> local_c10;
  basic_cstring<const_char> local_c00;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_bf0;
  iterator it;
  type *z;
  type *y;
  type *x;
  uint local_bb8;
  _Base_ptr local_bb0;
  undefined1 local_ba8;
  _Base_ptr local_ba0;
  undefined1 local_b98;
  _Self local_b90;
  _Self local_b88;
  const_iterator it_1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  int local_ae8 [2];
  pair<unsigned_int,_unsigned_int> local_ae0;
  iterator local_ad8;
  size_type local_ad0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_ac8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_aa9;
  int local_aa8 [2];
  pair<unsigned_int,_unsigned_int> local_aa0;
  iterator local_a98;
  size_type local_a90;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a88;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_a69;
  int local_a68 [10];
  pair<unsigned_int,_unsigned_int> local_a40;
  pair<unsigned_int,_unsigned_int> local_a38;
  pair<unsigned_int,_unsigned_int> local_a30;
  pair<unsigned_int,_unsigned_int> local_a28;
  pair<unsigned_int,_unsigned_int> local_a20;
  iterator local_a18;
  size_type local_a10;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a08;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_9e9;
  int local_9e8 [6];
  pair<unsigned_int,_unsigned_int> local_9d0;
  pair<unsigned_int,_unsigned_int> local_9c8;
  pair<unsigned_int,_unsigned_int> local_9c0;
  iterator local_9b8;
  size_type local_9b0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_9a8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_989;
  int local_988 [8];
  pair<unsigned_int,_unsigned_int> local_968;
  pair<unsigned_int,_unsigned_int> local_960;
  pair<unsigned_int,_unsigned_int> local_958;
  pair<unsigned_int,_unsigned_int> local_950;
  iterator local_948;
  size_type local_940;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_938;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_919;
  int local_918 [6];
  pair<unsigned_int,_unsigned_int> local_900;
  pair<unsigned_int,_unsigned_int> local_8f8;
  pair<unsigned_int,_unsigned_int> local_8f0;
  iterator local_8e8;
  size_type local_8e0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_8d8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_8b9;
  int local_8b8 [8];
  pair<unsigned_int,_unsigned_int> local_898;
  pair<unsigned_int,_unsigned_int> local_890;
  pair<unsigned_int,_unsigned_int> local_888;
  pair<unsigned_int,_unsigned_int> local_880;
  iterator local_878;
  size_type local_870;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_868;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_849;
  int local_848 [6];
  pair<unsigned_int,_unsigned_int> local_830;
  pair<unsigned_int,_unsigned_int> local_828;
  pair<unsigned_int,_unsigned_int> local_820;
  iterator local_818;
  size_type local_810;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_808;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_7e9;
  int local_7e8 [4];
  pair<unsigned_int,_unsigned_int> local_7d8;
  pair<unsigned_int,_unsigned_int> local_7d0;
  iterator local_7c8;
  size_type local_7c0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_7b8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_799;
  int local_798 [2];
  pair<unsigned_int,_unsigned_int> local_790;
  iterator local_788;
  size_type local_780;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_778;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_759;
  int local_758 [4];
  pair<unsigned_int,_unsigned_int> local_748;
  pair<unsigned_int,_unsigned_int> local_740;
  iterator local_738;
  size_type local_730;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_728;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_709;
  int local_708 [4];
  pair<unsigned_int,_unsigned_int> local_6f8;
  pair<unsigned_int,_unsigned_int> local_6f0;
  iterator local_6e8;
  size_type local_6e0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_6d8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_6b9;
  int local_6b8 [4];
  pair<unsigned_int,_unsigned_int> local_6a8;
  pair<unsigned_int,_unsigned_int> local_6a0;
  iterator local_698;
  size_type local_690;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_688;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_669;
  int local_668 [4];
  pair<unsigned_int,_unsigned_int> local_658;
  pair<unsigned_int,_unsigned_int> local_650;
  iterator local_648;
  size_type local_640;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_638;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_619;
  int local_618 [4];
  pair<unsigned_int,_unsigned_int> local_608;
  pair<unsigned_int,_unsigned_int> local_600;
  iterator local_5f8;
  size_type local_5f0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_5e8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_5c9;
  int local_5c8 [4];
  pair<unsigned_int,_unsigned_int> local_5b8;
  pair<unsigned_int,_unsigned_int> local_5b0;
  iterator local_5a8;
  size_type local_5a0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_598;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_579;
  int local_578 [2];
  pair<unsigned_int,_unsigned_int> local_570;
  iterator local_568;
  size_type local_560;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_558;
  undefined1 local_540 [8];
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  reducedMatrix;
  Barcode *barcode;
  int local_518 [4];
  pair<unsigned_int,_unsigned_int> local_508;
  pair<unsigned_int,_unsigned_int> local_500;
  pair<unsigned_int,_unsigned_int> local_4f8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_4f0;
  Insertion_return local_4e0;
  int local_4c8 [6];
  pair<unsigned_int,_unsigned_int> local_4b0;
  pair<unsigned_int,_unsigned_int> local_4a8;
  pair<unsigned_int,_unsigned_int> local_4a0;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_498;
  Insertion_return local_488;
  int local_470 [4];
  pair<unsigned_int,_unsigned_int> local_460;
  pair<unsigned_int,_unsigned_int> local_458;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_450;
  Insertion_return local_440;
  int local_428 [4];
  pair<unsigned_int,_unsigned_int> local_418;
  pair<unsigned_int,_unsigned_int> local_410;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_408;
  Insertion_return local_3f8;
  int local_3e0 [4];
  pair<unsigned_int,_unsigned_int> local_3d0;
  pair<unsigned_int,_unsigned_int> local_3c8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_3c0;
  Insertion_return local_3b0;
  int local_398 [4];
  pair<unsigned_int,_unsigned_int> local_388;
  pair<unsigned_int,_unsigned_int> local_380;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_378;
  Insertion_return local_368;
  int local_350 [4];
  pair<unsigned_int,_unsigned_int> local_340;
  pair<unsigned_int,_unsigned_int> local_338;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_330;
  Insertion_return local_320;
  int local_308 [4];
  pair<unsigned_int,_unsigned_int> local_2f8;
  pair<unsigned_int,_unsigned_int> local_2f0;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_2e8;
  Insertion_return local_2d8;
  int local_2c0 [4];
  pair<unsigned_int,_unsigned_int> local_2b0;
  pair<unsigned_int,_unsigned_int> local_2a8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_2a0;
  Insertion_return local_290;
  int local_278 [4];
  pair<unsigned_int,_unsigned_int> local_268;
  pair<unsigned_int,_unsigned_int> local_260;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_258;
  Insertion_return local_248;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_230;
  Insertion_return local_220;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_208;
  Insertion_return local_1f8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_1e0;
  Insertion_return local_1d0;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_1b8;
  Insertion_return local_1a8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_190;
  Insertion_return local_180;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_168;
  Insertion_return local_158;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_130;
  Insertion_return local_120;
  undefined1 local_108 [8];
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  m;
  
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
            *)local_108,0x11,2);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_130);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_120,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0,&local_130,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_120);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_168);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_158,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,1,&local_168,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_158);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_190);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_180,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,2,&local_190,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_180);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_1b8);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_1a8,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,3,&local_1b8,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_1a8);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_1e0);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_1d0,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,4,&local_1e0,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_1d0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_208);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_1f8,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,5,&local_208,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_1f8);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_230);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_220,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,6,&local_230,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_220);
  local_278[3] = 0;
  local_278[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_268,local_278 + 3,local_278 + 2);
  local_278[1] = 1;
  local_278[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_260,local_278 + 1,local_278);
  local_258._M_array = &local_268;
  local_258._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_248,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,10,&local_258,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_248);
  local_2c0[3] = 1;
  local_2c0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2b0,local_2c0 + 3,local_2c0 + 2);
  local_2c0[1] = 3;
  local_2c0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2a8,local_2c0 + 1,local_2c0);
  local_2a0._M_array = &local_2b0;
  local_2a0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_290,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0xb,&local_2a0,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_290);
  local_308[3] = 2;
  local_308[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2f8,local_308 + 3,local_308 + 2);
  local_308[1] = 3;
  local_308[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2f0,local_308 + 1,local_308);
  local_2e8._M_array = &local_2f8;
  local_2e8._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_2d8,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0xc,&local_2e8,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_2d8);
  local_350[3] = 2;
  local_350[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_340,local_350 + 3,local_350 + 2);
  local_350[1] = 4;
  local_350[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_338,local_350 + 1,local_350);
  local_330._M_array = &local_340;
  local_330._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_320,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0xd,&local_330,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_320);
  local_398[3] = 3;
  local_398[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_388,local_398 + 3,local_398 + 2);
  local_398[1] = 4;
  local_398[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_380,local_398 + 1,local_398);
  local_378._M_array = &local_388;
  local_378._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_368,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0xe,&local_378,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_368);
  local_3e0[3] = 2;
  local_3e0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_3d0,local_3e0 + 3,local_3e0 + 2);
  local_3e0[1] = 6;
  local_3e0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_3c8,local_3e0 + 1,local_3e0);
  local_3c0._M_array = &local_3d0;
  local_3c0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_3b0,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0xf,&local_3c0,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_3b0);
  local_428[3] = 4;
  local_428[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_418,local_428 + 3,local_428 + 2);
  local_428[1] = 6;
  local_428[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_410,local_428 + 1,local_428);
  local_408._M_array = &local_418;
  local_408._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_3f8,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0x10,&local_408,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_3f8);
  local_470[3] = 5;
  local_470[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_460,local_470 + 3,local_470 + 2);
  local_470[1] = 6;
  local_470[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_458,local_470 + 1,local_470);
  local_450._M_array = &local_460;
  local_450._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_440,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0x11,&local_450,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_440);
  local_4c8[5] = 0xc;
  local_4c8[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_4b0,local_4c8 + 5,local_4c8 + 4);
  local_4c8[3] = 0xd;
  local_4c8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_4a8,local_4c8 + 3,local_4c8 + 2);
  local_4c8[1] = 0xe;
  local_4c8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_4a0,local_4c8 + 1,local_4c8);
  local_498._M_array = &local_4b0;
  local_498._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_488,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0x1e,&local_498,2);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_488);
  local_518[3] = 0xd;
  local_518[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_508,local_518 + 3,local_518 + 2);
  local_518[1] = 0xf;
  local_518[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_500,local_518 + 1,local_518);
  barcode._4_4_ = 0x10;
  barcode._0_4_ = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_4f8,(int *)((long)&barcode + 4),(int *)&barcode);
  local_4f0._M_array = &local_508;
  local_4f0._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (&local_4e0,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)local_108,0x1f,&local_4f0,2);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_4e0);
  reducedMatrix.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Gudhi::persistence_matrix::
                Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
                ::get_current_barcode_abi_cxx11_
                          ((Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
                            *)local_108);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            *)local_540);
  local_578[1] = 0;
  local_578[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_570,local_578 + 1,local_578);
  local_568 = &local_570;
  local_560 = 1;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_579);
  __l_15._M_len = local_560;
  __l_15._M_array = local_568;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_558,__l_15,&local_579);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_558);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_558);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_579);
  local_5c8[3] = 0;
  local_5c8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_5b8,local_5c8 + 3,local_5c8 + 2);
  local_5c8[1] = 1;
  local_5c8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_5b0,local_5c8 + 1,local_5c8);
  local_5a8 = &local_5b8;
  local_5a0 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_5c9);
  __l_14._M_len = local_5a0;
  __l_14._M_array = local_5a8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_598,__l_14,&local_5c9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_598);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_598);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_5c9);
  local_618[3] = 0;
  local_618[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_608,local_618 + 3,local_618 + 2);
  local_618[1] = 2;
  local_618[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_600,local_618 + 1,local_618);
  local_5f8 = &local_608;
  local_5f0 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_619);
  __l_13._M_len = local_5f0;
  __l_13._M_array = local_5f8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_5e8,__l_13,&local_619);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_5e8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_5e8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_619);
  local_668[3] = 0;
  local_668[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_658,local_668 + 3,local_668 + 2);
  local_668[1] = 3;
  local_668[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_650,local_668 + 1,local_668);
  local_648 = &local_658;
  local_640 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_669);
  __l_12._M_len = local_640;
  __l_12._M_array = local_648;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_638,__l_12,&local_669);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_638);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_638);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_669);
  local_6b8[3] = 0;
  local_6b8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6a8,local_6b8 + 3,local_6b8 + 2);
  local_6b8[1] = 4;
  local_6b8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_6a0,local_6b8 + 1,local_6b8);
  local_698 = &local_6a8;
  local_690 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_6b9);
  __l_11._M_len = local_690;
  __l_11._M_array = local_698;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_688,__l_11,&local_6b9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_688);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_688);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_6b9);
  local_708[3] = 0;
  local_708[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6f8,local_708 + 3,local_708 + 2);
  local_708[1] = 5;
  local_708[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_6f0,local_708 + 1,local_708);
  local_6e8 = &local_6f8;
  local_6e0 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_709);
  __l_10._M_len = local_6e0;
  __l_10._M_array = local_6e8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_6d8,__l_10,&local_709);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_6d8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_6d8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_709);
  local_758[3] = 0;
  local_758[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_748,local_758 + 3,local_758 + 2);
  local_758[1] = 6;
  local_758[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_740,local_758 + 1,local_758);
  local_738 = &local_748;
  local_730 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_759);
  __l_09._M_len = local_730;
  __l_09._M_array = local_738;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_728,__l_09,&local_759);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_728);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_728);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_759);
  local_798[1] = 10;
  local_798[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_790,local_798 + 1,local_798);
  local_788 = &local_790;
  local_780 = 1;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_799);
  __l_08._M_len = local_780;
  __l_08._M_array = local_788;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_778,__l_08,&local_799);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_778);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_778);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_799);
  local_7e8[3] = 10;
  local_7e8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_7d8,local_7e8 + 3,local_7e8 + 2);
  local_7e8[1] = 0xb;
  local_7e8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_7d0,local_7e8 + 1,local_7e8);
  local_7c8 = &local_7d8;
  local_7c0 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_7e9);
  __l_07._M_len = local_7c0;
  __l_07._M_array = local_7c8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_7b8,__l_07,&local_7e9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_7b8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_7b8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_7e9);
  local_848[5] = 10;
  local_848[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_830,local_848 + 5,local_848 + 4);
  local_848[3] = 0xb;
  local_848[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_828,local_848 + 3,local_848 + 2);
  local_848[1] = 0xc;
  local_848[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_820,local_848 + 1,local_848);
  local_818 = &local_830;
  local_810 = 3;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_849);
  __l_06._M_len = local_810;
  __l_06._M_array = local_818;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_808,__l_06,&local_849);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_808);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_808);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_849);
  local_8b8[7] = 10;
  local_8b8[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_898,local_8b8 + 7,local_8b8 + 6);
  local_8b8[5] = 0xb;
  local_8b8[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_890,local_8b8 + 5,local_8b8 + 4);
  local_8b8[3] = 0xc;
  local_8b8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_888,local_8b8 + 3,local_8b8 + 2);
  local_8b8[1] = 0xd;
  local_8b8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_880,local_8b8 + 1,local_8b8);
  local_878 = &local_898;
  local_870 = 4;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_8b9);
  __l_05._M_len = local_870;
  __l_05._M_array = local_878;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_868,__l_05,&local_8b9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_868);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_868);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_8b9);
  local_918[5] = 0xc;
  local_918[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_900,local_918 + 5,local_918 + 4);
  local_918[3] = 0xd;
  local_918[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8f8,local_918 + 3,local_918 + 2);
  local_918[1] = 0xe;
  local_918[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_8f0,local_918 + 1,local_918);
  local_8e8 = &local_900;
  local_8e0 = 3;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_919);
  __l_04._M_len = local_8e0;
  __l_04._M_array = local_8e8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_8d8,__l_04,&local_919);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_8d8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_8d8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_919);
  local_988[7] = 10;
  local_988[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_968,local_988 + 7,local_988 + 6);
  local_988[5] = 0xb;
  local_988[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_960,local_988 + 5,local_988 + 4);
  local_988[3] = 0xc;
  local_988[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_958,local_988 + 3,local_988 + 2);
  local_988[1] = 0xf;
  local_988[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_950,local_988 + 1,local_988);
  local_948 = &local_968;
  local_940 = 4;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_989);
  __l_03._M_len = local_940;
  __l_03._M_array = local_948;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_938,__l_03,&local_989);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_938);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_938);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_989);
  local_9e8[5] = 0xd;
  local_9e8[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_9d0,local_9e8 + 5,local_9e8 + 4);
  local_9e8[3] = 0xf;
  local_9e8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_9c8,local_9e8 + 3,local_9e8 + 2);
  local_9e8[1] = 0x10;
  local_9e8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_9c0,local_9e8 + 1,local_9e8);
  local_9b8 = &local_9d0;
  local_9b0 = 3;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_9e9);
  __l_02._M_len = local_9b0;
  __l_02._M_array = local_9b8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_9a8,__l_02,&local_9e9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_9a8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_9a8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_9e9);
  local_a68[9] = 10;
  local_a68[8] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_a40,local_a68 + 9,local_a68 + 8);
  local_a68[7] = 0xb;
  local_a68[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_a38,local_a68 + 7,local_a68 + 6);
  local_a68[5] = 0xc;
  local_a68[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_a30,local_a68 + 5,local_a68 + 4);
  local_a68[3] = 0xf;
  local_a68[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_a28,local_a68 + 3,local_a68 + 2);
  local_a68[1] = 0x11;
  local_a68[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_a20,local_a68 + 1,local_a68);
  local_a18 = &local_a40;
  local_a10 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_a69);
  __l_01._M_len = local_a10;
  __l_01._M_array = local_a18;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_a08,__l_01,&local_a69);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_a08);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_a08);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_a69);
  local_aa8[1] = 0x1e;
  local_aa8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_aa0,local_aa8 + 1,local_aa8);
  local_a98 = &local_aa0;
  local_a90 = 1;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_aa9);
  __l_00._M_len = local_a90;
  __l_00._M_array = local_a98;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_a88,__l_00,&local_aa9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_a88);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_a88);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_aa9);
  local_ae8[1] = 0x1f;
  local_ae8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_ae0,local_ae8 + 1,local_ae8);
  local_ad8 = &local_ae0;
  local_ad0 = 1;
  this = (allocator<std::pair<unsigned_int,_unsigned_int>_> *)
         ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(this);
  __l._M_len = local_ad0;
  __l._M_array = local_ad8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_ac8,__l,this);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_540,&local_ac8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_ac8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)
             ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_540,
             (Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
              *)local_108);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  local_b88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::begin((list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_b90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end((list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_b88,&local_b90);
    if (!bVar2) break;
    __args = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_b88);
    pPVar3 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_b88);
    pPVar4 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_b88);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,&__args->dim,
                        &pPVar3->birth,&pPVar4->death);
    local_ba0 = (_Base_ptr)pVar11.first._M_node;
    local_b98 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_b88);
    __args_00 = std::get<2ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_b88);
    __args_1 = std::get<0ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_b88);
    __args_2 = std::get<1ul,int,unsigned_int>(pPVar5);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count,__args_00,
                        __args_1,__args_2);
    local_bb0 = (_Base_ptr)pVar11.first._M_node;
    local_ba8 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_b88);
    local_bb8 = pPVar5->death;
    x = *(type **)pPVar5;
    __args_1_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<0ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_2_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<1ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_01 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<2ul>
                          ((Persistence_interval<int,unsigned_int> *)&x);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int&,unsigned_int&,unsigned_int&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&it_1,__args_01,__args_1_00,__args_2_00);
    it._M_node = (_Base_ptr)pVar11.first._M_node;
    std::_List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>::
    operator++(&local_b88);
  }
  local_bf0._M_node =
       (_Base_ptr)
       std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
       begin((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c00,0x634,&local_c10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c38,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_c4c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c38,&local_c48,0x634,1,2,p_Var8,"std::get<0>(*it)",&local_c4c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c60,0x635,&local_c70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c98,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_cac = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c98,&local_ca8,0x635,1,2,p_Var9,"std::get<1>(*it)",&local_cac,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cc0,0x636,&local_cd0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_cf8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_d0c = 0xffffffff;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_cf8,&local_d08,0x636,1,2,p_Var10,"std::get<2>(*it)",&local_d0c,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_cf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d20,0x638,&local_d30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d58,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_d6c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d58,&local_d68,0x638,1,2,p_Var8,"std::get<0>(*it)",&local_d6c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d80,0x639,&local_d90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_db8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dc8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_dcc = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_db8,&local_dc8,0x639,1,2,p_Var9,"std::get<1>(*it)",&local_dcc,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_db8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_df0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_de0,0x63a,&local_df0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e18,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_e2c = 7;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e18,&local_e28,0x63a,1,2,p_Var10,"std::get<2>(*it)",&local_e2c,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e40,0x63c,&local_e50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e78,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_e8c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e78,&local_e88,0x63c,1,2,p_Var8,"std::get<0>(*it)",&local_e8c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ea0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_eb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ea0,0x63d,&local_eb0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ed8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ee8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_eec = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ed8,&local_ee8,0x63d,1,2,p_Var9,"std::get<1>(*it)",&local_eec,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ed8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f00,0x63e,&local_f10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f38,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_f4c = 9;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f38,&local_f48,0x63e,1,2,p_Var10,"std::get<2>(*it)",&local_f4c,"9");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f60,0x640,&local_f70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f98,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fa8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_fac = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f98,&local_fa8,0x640,1,2,p_Var8,"std::get<0>(*it)",&local_fac,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_fc0,0x641,&local_fd0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ff8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1008,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_100c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ff8,&local_1008,0x641,1,2,p_Var9,"std::get<1>(*it)",&local_100c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ff8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1020,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1030);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1020,0x642,&local_1030);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1058,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1068,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_106c = 8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1058,&local_1068,0x642,1,2,p_Var10,"std::get<2>(*it)",&local_106c,"8");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1058);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1080,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1090);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1080,0x644,&local_1090);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_10b8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_10cc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_10b8,&local_10c8,0x644,1,2,p_Var8,"std::get<0>(*it)",&local_10cc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_10b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10e0,0x645,&local_10f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1118,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_112c = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1118,&local_1128,0x645,1,2,p_Var9,"std::get<1>(*it)",&local_112c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1118);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1140,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1150);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1140,0x646,&local_1150);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1178,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_118c = 10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1178,&local_1188,0x646,1,2,p_Var10,"std::get<2>(*it)",&local_118c,"10");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_11a0,0x648,&local_11b0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_11d8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_11ec = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_11d8,&local_11e8,0x648,1,2,p_Var8,"std::get<0>(*it)",&local_11ec,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_11d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1200,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1210);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1200,0x649,&local_1210);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1238,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1248,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_124c = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1238,&local_1248,0x649,1,2,p_Var9,"std::get<1>(*it)",&local_124c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1260,0x64a,&local_1270);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1298,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_12ac = 0xe;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1298,&local_12a8,0x64a,1,2,p_Var10,"std::get<2>(*it)",&local_12ac,"14");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_12d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_12c0,0x64c,&local_12d0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_12f8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_130c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_12f8,&local_1308,0x64c,1,2,p_Var8,"std::get<0>(*it)",&local_130c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_12f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1320,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1330);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1320,0x64d,&local_1330);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1358,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1368,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_136c = 6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1358,&local_1368,0x64d,1,2,p_Var9,"std::get<1>(*it)",&local_136c,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1380,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1390);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1380,0x64e,&local_1390);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_13b8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_13cc = 0xc;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_13b8,&local_13c8,0x64e,1,2,p_Var10,"std::get<2>(*it)",&local_13cc,"12");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_13b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_13f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_13e0,0x650,&local_13f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1418,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_142c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1418,&local_1428,0x650,1,2,p_Var8,"std::get<0>(*it)",&local_142c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1418);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1440,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1450);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1440,0x651,&local_1450);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1478,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_148c = 0xb;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1478,&local_1488,0x651,1,2,p_Var9,"std::get<1>(*it)",&local_148c,"11");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1478);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_14b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_14a0,0x652,&local_14b0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_14d8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_14ec = 0xf;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_14d8,&local_14e8,0x652,1,2,p_Var10,"std::get<2>(*it)",&local_14ec,"15");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_14d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1510);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1500,0x654,&local_1510);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1538,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1548,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_154c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1538,&local_1548,0x654,1,2,p_Var8,"std::get<0>(*it)",&local_154c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1560,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1570);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1560,0x655,&local_1570);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1598,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_15ac = 0xd;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1598,&local_15a8,0x655,1,2,p_Var9,"std::get<1>(*it)",&local_15ac,"13");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1598);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_15d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_15c0,0x656,&local_15d0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_15f8,plVar6,(char (*) [1])0x2ac232);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1608,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_bf0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_160c = 0x10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_15f8,&local_1608,0x656,1,2,p_Var10,"std::get<2>(*it)",&local_160c,"16");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_15f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_bf0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1620,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1630);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1620,0x658,&local_1630);
    local_1650._M_node =
         (_Base_ptr)
         std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
         end((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator==(&local_bf0,&local_1650);
    boost::test_tools::assertion_result::assertion_result(&local_1648,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1680,"it == bars1.end()",0x11);
    boost::unit_test::operator<<(&local_1670,plVar6,&local_1680);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1648,&local_1670,&local_1690,0x658,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1670);
    boost::test_tools::assertion_result::~assertion_result(&local_1648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_16a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_16b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_16a0,0x65a,&local_16b0);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::test_tools::assertion_result::assertion_result(&local_16c8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_16f8,"bars1 == bars2",0xe);
    boost::unit_test::operator<<(&local_16e8,plVar6,&local_16f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1708,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_16c8,&local_16e8,&local_1708,0x65a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_16e8);
    boost::test_tools::assertion_result::~assertion_result(&local_16c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1718,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1728);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1718,0x65b,&local_1728);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&it_1);
    boost::test_tools::assertion_result::assertion_result(&local_1740,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1770,"bars1 == bars3",0xe);
    boost::unit_test::operator<<(&local_1760,plVar6,&local_1770);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1780,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1740,&local_1760,&local_1780,0x65b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1760);
    boost::test_tools::assertion_result::~assertion_result(&local_1740);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_540);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
             *)local_108);
  return;
}

Assistant:

void test_shifted_barcode1() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(17, 2);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {0, 1}, 1);
    m.insert_boundary(11, {1, 3}, 1);
    m.insert_boundary(12, {2, 3}, 1);
    m.insert_boundary(13, {2, 4}, 1);
    m.insert_boundary(14, {3, 4}, 1);
    m.insert_boundary(15, {2, 6}, 1);
    m.insert_boundary(16, {4, 6}, 1);
    m.insert_boundary(17, {5, 6}, 1);
    m.insert_boundary(30, {12, 13, 14}, 2);
    m.insert_boundary(31, {13, 15, 16}, 2);
  } else {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {{0, 1}, {1, 1}}, 1);
    m.insert_boundary(11, {{1, 1}, {3, 1}}, 1);
    m.insert_boundary(12, {{2, 1}, {3, 1}}, 1);
    m.insert_boundary(13, {{2, 1}, {4, 1}}, 1);
    m.insert_boundary(14, {{3, 1}, {4, 1}}, 1);
    m.insert_boundary(15, {{2, 1}, {6, 1}}, 1);
    m.insert_boundary(16, {{4, 1}, {6, 1}}, 1);
    m.insert_boundary(17, {{5, 1}, {6, 1}}, 1);
    m.insert_boundary(30, {{12, 1}, {13, 1}, {14, 1}}, 2);
    m.insert_boundary(31, {{13, 1}, {15, 1}, {16, 1}}, 2);
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({1, 3});
      reducedMatrix.push_back({1, 2});
      reducedMatrix.push_back({2, 4});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 6});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({13, 15, 16});
    } else {
      reducedMatrix.push_back({0});
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({0, 2});
      reducedMatrix.push_back({0, 3});
      reducedMatrix.push_back({0, 4});
      reducedMatrix.push_back({0, 5});
      reducedMatrix.push_back({0, 6});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({10, 11});
      reducedMatrix.push_back({10, 11, 12});
      reducedMatrix.push_back({10, 11, 12, 13});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({10, 11, 12, 15});
      reducedMatrix.push_back({13, 15, 16});
      reducedMatrix.push_back({10, 11, 12, 15, 17});
      reducedMatrix.push_back({30});
      reducedMatrix.push_back({31});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{1, 1}, {3, 1}});
      reducedMatrix.push_back({{1, 1}, {2, 1}});
      reducedMatrix.push_back({{2, 1}, {4, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {6, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {5, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
    } else {
      reducedMatrix.push_back({{0, 1}});
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{0, 1}, {2, 1}});
      reducedMatrix.push_back({{0, 1}, {3, 1}});
      reducedMatrix.push_back({{0, 1}, {4, 1}});
      reducedMatrix.push_back({{0, 1}, {5, 1}});
      reducedMatrix.push_back({{0, 1}, {6, 1}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {13, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}, {17, 1}});
      reducedMatrix.push_back({{30, 1}});
      reducedMatrix.push_back({{31, 1}});
    }
  }

  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(0)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(1)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(4)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(6)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[9], get_column_content_via_iterators(m.get_column(12)));
    test_column_equality<C>(reducedMatrix[10], get_column_content_via_iterators(m.get_column(13)));
    test_column_equality<C>(reducedMatrix[11], get_column_content_via_iterators(m.get_column(14)));
    test_column_equality<C>(reducedMatrix[12], get_column_content_via_iterators(m.get_column(15)));
    test_column_equality<C>(reducedMatrix[13], get_column_content_via_iterators(m.get_column(16)));
    test_column_equality<C>(reducedMatrix[14], get_column_content_via_iterators(m.get_column(17)));
    test_column_equality<C>(reducedMatrix[15], get_column_content_via_iterators(m.get_column(30)));
    test_column_equality<C>(reducedMatrix[16], get_column_content_via_iterators(m.get_column(31)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 7);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 9);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 3);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 4);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 10);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 14);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 6);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 12);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 11);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 15);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 13);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 16);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}